

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EnvironmentType::Encode(EnvironmentType *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  EnvironmentType *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8EntityKind);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Domain);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Class);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Category);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8SubCategory);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Specific);
  KDataStream::operator<<(pKVar1,this->m_ui8Extra);
  return;
}

Assistant:

void EnvironmentType::Encode( KDataStream & stream ) const
{
    stream << m_ui8EntityKind
           << m_ui8Domain
           << m_ui16Class
           << m_ui8Category
           << m_ui8SubCategory
           << m_ui8Specific
           << m_ui8Extra;
}